

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O1

Unit * __thiscall
Shell::AnswerLiteralManager::tryAddingAnswerLiteral(AnswerLiteralManager *this,Unit *unit)

{
  uint var;
  VList *vars;
  SList *srts;
  size_type sVar1;
  uint *puVar2;
  Symbol *this_00;
  pointer pcVar3;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
  *pMVar4;
  undefined8 uVar5;
  bool bVar6;
  uint function;
  size_type *psVar7;
  Literal *pLVar8;
  undefined4 *puVar9;
  undefined8 *puVar10;
  Formula *pFVar11;
  undefined4 *puVar12;
  Entry *pEVar13;
  OperatorKey *key;
  OperatorType *type;
  Term *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  Unit *this_01;
  uint uVar15;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
  *pMVar16;
  uint64_t *puVar17;
  InferenceRule IVar18;
  void **head_1;
  AnswerLiteralManager *this_02;
  void **head;
  pair<Kernel::Unit_*,_Kernel::Literal_*> val;
  Substitution subst;
  TermList sort;
  string local_f0;
  Formula *local_d0;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
  *local_c8;
  Connective local_bc;
  SList *local_b8;
  AnswerLiteralManager *local_b0;
  Inference local_a8;
  FormulaClauseTransformation local_70;
  Inference local_60;
  
  if ((((unit->field_0x4 & 1) != 0) &&
      (((undefined1  [48])unit->_inference & (undefined1  [48])0x18) == (undefined1  [48])0x8)) &&
     (**(int **)(unit + 1) == 6)) {
    local_d0 = *(Formula **)(*(int **)(unit + 1) + 10);
    local_bc = local_d0->_connective;
    pFVar11 = local_d0;
    if ((local_bc == EXISTS) ||
       ((local_bc == FORALL &&
        (pFVar11 = (Formula *)local_d0[1]._label._M_string_length, pFVar11->_connective == EXISTS)))
       ) {
      vars = *(VList **)(pFVar11 + 1);
      srts = (SList *)pFVar11[1]._label._M_dataplus._M_p;
      sVar1 = pFVar11[1]._label._M_string_length;
      this_02 = (AnswerLiteralManager *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
      local_c8 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
                  *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
      psVar7 = (size_type *)
               ::Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
      ;
      *psVar7 = sVar1;
      psVar7[1] = 0;
      local_b8 = srts;
      pLVar8 = getAnswerLiteral(this_02,vars,srts,pFVar11);
      val.second = pLVar8;
      val.first = unit;
      local_b0 = this;
      ::Lib::
      DHMap<unsigned_int,_std::pair<Kernel::Unit_*,_Kernel::Literal_*>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert(&this->_originUnitsAndInjectedLiterals,(pLVar8->super_Term)._functor,val);
      puVar9 = (undefined4 *)
               ::Lib::FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
      ;
      *puVar9 = 0;
      *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(puVar9 + 10) = pLVar8;
      puVar10 = (undefined8 *)
                ::Lib::FixedSizeAllocator<16UL>::alloc((FixedSizeAllocator<16UL> *)local_c8);
      *puVar10 = puVar9;
      puVar10[1] = psVar7;
      pFVar11 = (Formula *)
                ::Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                          );
      puVar9 = (undefined4 *)
               ::Lib::FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
      ;
      puVar12 = (undefined4 *)
                ::Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                          );
      *puVar12 = 1;
      *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar12 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(undefined8 **)(puVar12 + 10) = puVar10;
      *puVar9 = 8;
      *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(VList **)(puVar9 + 10) = vars;
      *(SList **)(puVar9 + 0xc) = local_b8;
      *(undefined4 **)(puVar9 + 0xe) = puVar12;
      pFVar11->_connective = NOT;
      (pFVar11->_label)._M_dataplus._M_p = (pointer)&(pFVar11->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar11->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(undefined4 **)(pFVar11 + 1) = puVar9;
      IVar18 = ANSWER_LITERAL_INJECTION;
      if (local_bc != EXISTS) {
        local_a8._0_4_ = unit->_number;
        pEVar13 = ::Lib::
                  DHMap<unsigned_int,_Lib::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::findEntry(&Parse::TPTP::_questionVariableNames_abi_cxx11_,(uint *)&local_a8);
        if (pEVar13 == (Entry *)0x0) {
          pMVar16 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
                     *)0x0;
        }
        else {
          pMVar16 = pEVar13->_val;
        }
        puVar2 = *(uint **)(local_d0 + 1);
        puVar17 = (uint64_t *)local_d0[1]._label._M_dataplus._M_p;
        local_a8._0_4_ = 1;
        local_a8._4_4_ = 0;
        local_a8._8_4_ = 0;
        local_a8._age = 0;
        local_a8._splits._0_4_ = 0;
        local_a8._splits._4_4_ = 0;
        local_a8._ptr1._0_4_ = 0;
        local_a8._ptr1._4_4_ = 0;
        local_a8._ptr2._0_4_ = 0;
        local_a8._ptr2._4_4_ = 0;
        pMVar4 = local_c8;
        while (local_c8 = pMVar16, puVar2 != (uint *)0x0) {
          var = *puVar2;
          puVar2 = *(uint **)(puVar2 + 2);
          function = Kernel::Signature::addSkolemFunction(DAT_00b7e1b0,0,"in",true);
          this_00 = (DAT_00b7e1b0->_funs)._stack[function];
          local_60._0_8_ = 2;
          uVar15 = function;
          if (puVar17 == (uint64_t *)0x0) {
            bVar6 = Kernel::SortHelper::tryGetVariableSort(var,local_d0,(TermList *)&local_60);
            puVar17 = (uint64_t *)0x0;
            if (!bVar6) {
              local_60._0_8_ = Kernel::AtomicSort::defaultSort();
            }
          }
          else {
            local_60._0_8_ = *puVar17;
            puVar17 = (uint64_t *)puVar17[1];
          }
          uVar5 = local_60._0_8_;
          key = Kernel::OperatorType::setupKey(0,(TermList *)0x0);
          *(undefined8 *)(key + 8) = uVar5;
          type = Kernel::OperatorType::getTypeFromKey(key,0);
          Kernel::Signature::Symbol::setType(this_00,type);
          __addr = Kernel::Term::create(function,0,(TermList *)0x0);
          pMVar16 = local_c8;
          Kernel::Substitution::bind((Substitution *)&local_a8,var,(sockaddr *)__addr,uVar15);
          if (pMVar16 ==
              (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
               *)0x0) {
            local_70._0_8_ = ZEXT48(var * 4 + 1);
            Kernel::TermList::toString_abi_cxx11_(&local_f0,(TermList *)&local_70,false);
          }
          else {
            pbVar14 = ::Lib::
                      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
                      ::get(pMVar16,var);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar3 = (pbVar14->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar3,pcVar3 + pbVar14->_M_string_length);
          }
          (*local_b0->_vptr_AnswerLiteralManager[6])(local_b0,__addr,(ulong)var,&local_f0);
          pMVar16 = local_c8;
          pMVar4 = local_c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            pMVar16 = local_c8;
            pMVar4 = local_c8;
          }
        }
        local_c8 = pMVar4;
        pFVar11 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                            (pFVar11,(Substitution *)&local_a8,false);
        ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   &local_a8);
        IVar18 = ANSWER_LITERAL_INPUT_SKOLEMISATION;
      }
      this_01 = (Unit *)::operator_new(0x48,8);
      local_70.rule = IVar18;
      local_70.premise = unit;
      Kernel::Inference::Inference(&local_60,&local_70);
      local_a8._ptr2._0_4_ = SUB84(local_60._ptr2,0);
      local_a8._ptr2._4_4_ = (undefined4)((ulong)local_60._ptr2 >> 0x20);
      local_a8.th_ancestors = local_60.th_ancestors;
      local_a8.all_ancestors = local_60.all_ancestors;
      local_a8._splits._0_4_ = SUB84(local_60._splits,0);
      local_a8._splits._4_4_ = (undefined4)((ulong)local_60._splits >> 0x20);
      local_a8._ptr1._0_4_ = SUB84(local_60._ptr1,0);
      local_a8._ptr1._4_4_ = (undefined4)((ulong)local_60._ptr1 >> 0x20);
      local_a8._0_4_ = local_60._0_4_;
      local_a8._4_4_ = local_60._4_4_;
      local_a8._8_4_ = local_60._8_4_;
      local_a8._age = local_60._age;
      Kernel::Unit::Unit(this_01,FORMULA,&local_a8);
      *(Formula **)(this_01 + 1) = pFVar11;
      *(undefined8 *)&this_01[1]._inference = 3;
      Kernel::Unit::doUnitTracing(this_01);
      unit = this_01;
    }
  }
  return unit;
}

Assistant:

Clause* AnswerLiteralResolver::simplify(Clause* cl)
{
  if (isProperAnswerClause(cl)) {
    return AnswerLiteralManager::getInstance()->getRefutation(cl);
  }
  return cl;
}